

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void __thiscall QApplicationPrivate::closePopup(QApplicationPrivate *this,QWidget *popup)

{
  bool bVar1;
  uint uVar2;
  QWindow *pQVar3;
  ulong uVar4;
  long lVar5;
  QRect *pQVar6;
  QWidget *pQVar7;
  QWidget *pQVar8;
  QWidgetWindow *pQVar9;
  qsizetype qVar10;
  QWidget *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *fw_1;
  QWidgetWindow *popupWin;
  QWidget *fw;
  QWindow *nextRemainingPopup;
  QWindow *win;
  QFocusEvent e;
  QWidget *in_stack_ffffffffffffff90;
  uint7 in_stack_ffffffffffffff98;
  byte bVar11;
  FocusReason FVar12;
  undefined8 local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QWidget::windowHandle(in_stack_ffffffffffffff90);
  if ((pQVar3 != (QWindow *)0x0) &&
     (uVar4 = QGuiApplicationPrivate::closePopup(pQVar3), (uVar4 & 1) != 0)) {
    lVar5 = QGuiApplicationPrivate::activePopupWindow();
    if (lVar5 == 0) {
      if ((popupGrabOk & 1U) != 0) {
        popupGrabOk = false;
        bVar11 = 0;
        if (active_window != (QWidget *)0x0) {
          pQVar3 = QWidget::windowHandle(in_stack_ffffffffffffff90);
          bVar11 = 0;
          if (pQVar3 != (QWindow *)0x0) {
            pQVar6 = QWidget::geometry(in_RSI);
            local_28 = QGuiApplicationPrivate::QLastCursorPosition::toPoint();
            uVar2 = QRect::contains((QPoint *)pQVar6,SUB81(&local_28,0));
            bVar11 = 0;
            if ((uVar2 & 1) == 0) {
              bVar1 = QWidget::testAttribute
                                ((QWidget *)(ulong)in_stack_ffffffffffffff98,
                                 (WidgetAttribute)((ulong)pQVar6 >> 0x20));
              bVar11 = bVar1 ^ 0xff;
            }
          }
        }
        if ((bVar11 & 1) != 0) {
          replayMousePress = true;
        }
        ungrabMouseForPopup((QWidget *)0x2d409b);
        ungrabKeyboardForPopup((QWidget *)0x2d40a5);
      }
      FVar12 = (FocusReason)((ulong)in_RSI >> 0x20);
      if ((active_window != (QWidget *)0x0) &&
         (pQVar7 = QWidget::focusWidget((QWidget *)0x2d40c5), pQVar7 != (QWidget *)0x0)) {
        pQVar8 = QApplication::focusWidget();
        if (pQVar7 == pQVar8) {
          local_20 = &DAT_aaaaaaaaaaaaaaaa;
          local_18 = &DAT_aaaaaaaaaaaaaaaa;
          local_10 = &DAT_aaaaaaaaaaaaaaaa;
          QFocusEvent::QFocusEvent((QFocusEvent *)&local_20,FocusIn,PopupFocusReason);
          QCoreApplication::sendEvent(&pQVar7->super_QObject,(QEvent *)&local_20);
          QFocusEvent::~QFocusEvent((QFocusEvent *)&local_20);
        }
        else {
          QWidget::setFocus(in_RDI,FVar12);
        }
      }
    }
    else {
      pQVar9 = qobject_cast<QWidgetWindow_const*>((QObject *)0x2d415e);
      FVar12 = (FocusReason)((ulong)in_RSI >> 0x20);
      if (pQVar9 != (QWidgetWindow *)0x0) {
        QWidgetWindow::widget((QWidgetWindow *)0x2d4175);
        pQVar7 = QWidget::focusWidget((QWidget *)0x2d417d);
        if (pQVar7 != (QWidget *)0x0) {
          QWidget::setFocus(in_RDI,FVar12);
        }
        qVar10 = QGuiApplicationPrivate::popupCount();
        if (qVar10 == 1) {
          QWidgetWindow::widget((QWidgetWindow *)0x2d41ae);
          grabForPopup((QWidget *)0x2d41b6);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::closePopup(QWidget *popup)
{
    QWindow *win = popup->windowHandle();
    if (!win)
        return;
    if (!QGuiApplicationPrivate::closePopup(win))
        return;

    const QWindow *nextRemainingPopup = QGuiApplicationPrivate::activePopupWindow();
    if (!nextRemainingPopup) { // this was the last popup

        if (popupGrabOk) {
            popupGrabOk = false;

            if (active_window && active_window->windowHandle()
                && !popup->geometry().contains(QGuiApplicationPrivate::lastCursorPosition.toPoint())
                && !popup->testAttribute(Qt::WA_NoMouseReplay)) {
                QApplicationPrivate::replayMousePress = true;
            }

            // transfer grab back to mouse grabber if any, otherwise release the grab
            ungrabMouseForPopup(popup);

            // transfer grab back to keyboard grabber if any, otherwise release the grab
            ungrabKeyboardForPopup(popup);
        }

        if (active_window) {
            if (QWidget *fw = active_window->focusWidget()) {
                if (fw != QApplication::focusWidget()) {
                    fw->setFocus(Qt::PopupFocusReason);
                } else {
                    QFocusEvent e(QEvent::FocusIn, Qt::PopupFocusReason);
                    QCoreApplication::sendEvent(fw, &e);
                }
            }
        }

    } else if (const auto *popupWin = qobject_cast<const QWidgetWindow *>(nextRemainingPopup)) {
        // A popup was closed, so the previous popup gets the focus.
        if (QWidget *fw = popupWin->widget()->focusWidget())
            fw->setFocus(Qt::PopupFocusReason);

        // can become nullptr due to setFocus() above
        if (QGuiApplicationPrivate::popupCount() == 1) // grab mouse/keyboard
            grabForPopup(popupWin->widget());
    }

}